

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::segmentcheckReverse(string *unit,char closeSegment,int *index)

{
  byte mchar;
  pointer pcVar1;
  char closeSegment_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *index;
  if ((int)uVar4 < 0 || (int)unit->_M_string_length <= (int)uVar4) {
    return false;
  }
LAB_001829cb:
  pcVar1 = (unit->_M_dataplus)._M_p;
  do {
    mchar = pcVar1[uVar4];
    uVar3 = uVar4 - 1;
    *index = uVar3;
    if ((uVar4 == 0) || (pcVar1[uVar3] != '\\')) {
      if (mchar == closeSegment) {
        return true;
      }
      uVar4 = uVar3;
      if (mchar < 0x5d) {
        if (mchar == 0x28) {
          return false;
        }
        if (mchar == 0x29) break;
        if (mchar == 0x5b) {
          return false;
        }
      }
      else {
        if (mchar == 0x7d) break;
        if (mchar == 0x7b) {
          return false;
        }
        if (mchar == 0x5d) break;
      }
    }
    else {
      *index = uVar4 - 2;
      uVar4 = uVar4 - 2;
    }
    if ((int)uVar4 < 0) {
      return false;
    }
  } while( true );
  closeSegment_00 = getMatchCharacter(mchar);
  bVar2 = segmentcheckReverse(unit,closeSegment_00,index);
  if (!bVar2) {
    return false;
  }
  uVar4 = *index;
  if ((int)uVar4 < 0) {
    return false;
  }
  goto LAB_001829cb;
}

Assistant:

static bool
    segmentcheckReverse(const std::string& unit, char closeSegment, int& index)
{
    if (index >= static_cast<int>(unit.size())) {
        // LCOV_EXCL_START
        return false;
        // LCOV_EXCL_STOP
    }
    while (index >= 0) {
        char current = unit[index];
        --index;
        if (index >= 0 && unit[index] == '\\') {
            --index;
            continue;
        }
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '}':
            case ')':
            case ']':
                if (!segmentcheckReverse(
                        unit, getMatchCharacter(current), index)) {
                    // LCOV_EXCL_START
                    return false;
                    // LCOV_EXCL_STOP
                }
                break;
            case '{':
            case '(':
            case '[':
                return false;
            default:
                break;
        }
    }
    // LCOV_EXCL_START
    return false;
    // LCOV_EXCL_STOP
}